

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void Node_RemoveNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  nodedata *pnVar2;
  nodedata *pnVar3;
  nodedata *pnVar4;
  nodedata *local_28;
  
  if (Node != (node *)0x0) {
    lVar1 = *Node->VMT;
    pnVar2 = (nodedata *)&Node->Data;
    pnVar4 = (nodedata *)0x0;
    do {
      pnVar2 = pnVar2->Next;
      if (pnVar2 == (nodedata *)0x0) goto LAB_00119e46;
    } while (pnVar2->Code != (Id << 8 | 0xe));
    pnVar4 = pnVar2 + 1;
LAB_00119e46:
    if (pnVar4 != (nodedata *)0x0) {
      pnVar2 = pnVar4[1].Next;
      pnVar3 = (nodedata *)&local_28;
      for (local_28 = pnVar4->Next; local_28 != (nodedata *)0x0; local_28 = local_28->Next) {
        if (((notifyproc)local_28->Code == Func) && (local_28[1].Next == (nodedata *)Referer)) {
          if (pnVar3->Next == pnVar4->Next) {
            pnVar3 = pnVar4;
          }
          pnVar3->Next = local_28->Next;
          if (pnVar4[1].Next == local_28) {
            pnVar4[1].Next = (nodedata *)0x0;
          }
          else {
            lVar1 = *(long *)(lVar1 + 0x80);
            (**(code **)(lVar1 + 8))(lVar1,local_28,0x18);
          }
          break;
        }
        pnVar3 = local_28;
      }
      if ((pnVar4->Next == (nodedata *)0x0) && (pnVar2 == pnVar4[1].Next)) {
        Node_RemoveData(Node,Id,0xe);
      }
    }
  }
  return;
}

Assistant:

void Node_RemoveNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;

        n = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (n)
        {
            nodenotify** Ptr;
            nodenotify* Top = n;
            void *OldReferer = Top->Referer;

            n = Top->Next; // skip the first element which is just there to know if an item of the chain is being notified
            Ptr = &n;
            for (;(n=*Ptr)!=NULL;Ptr=&n->Next)
            {
                if (n->Func==Func && n->Referer==Referer)
                {
                    // remove the item from the list
                    if (*Ptr == Top->Next)
                        Top->Next = n->Next;
                    else
                        *Ptr = n->Next;

                    if (Top->Referer==n) // this notification item is being called
                        Top->Referer = NULL; // tell the notifier that it should remove this element after the call
                    else
                        MemHeap_Free(p->NodeHeap,n,sizeof(nodenotify));
                    break;
                }
            }

            if (Top->Next==NULL && OldReferer==Top->Referer)
                Node_RemoveData(Node,Id,TYPE_NODENOTIFY); // the notification list is empty and it's not being called
        }
    }
}